

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_overflow_strings_to_disk.cpp
# Opt level: O3

void __thiscall
duckdb::UncompressedStringSegmentState::Cleanup
          (UncompressedStringSegmentState *this,BlockManager *manager_p)

{
  pointer plVar1;
  long *block_id;
  pointer plVar2;
  
  if ((this->block_manager).ptr != (BlockManager *)0x0) {
    optional_ptr<duckdb::BlockManager,_true>::CheckValid(&this->block_manager);
    manager_p = (this->block_manager).ptr;
  }
  plVar2 = (this->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  plVar1 = (this->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  if (plVar2 != plVar1) {
    do {
      (*manager_p->_vptr_BlockManager[9])(manager_p,*plVar2);
      plVar2 = plVar2 + 1;
    } while (plVar2 != plVar1);
    plVar2 = (this->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if ((this->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish !=
        plVar2) {
      (this->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
           plVar2;
    }
  }
  return;
}

Assistant:

void UncompressedStringSegmentState::Cleanup(BlockManager &manager_p) {
	auto &manager = block_manager ? *block_manager : manager_p;
	for (auto &block_id : on_disk_blocks) {
		manager.MarkBlockAsModified(block_id);
	}
	on_disk_blocks.clear();
}